

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragBehaviorT<double,double,double>
               (ImGuiDataType data_type,double *v,float v_speed,double v_min,double v_max,
               char *format,float power,ImGuiDragFlags flags)

{
  bool bVar1;
  float *pfVar2;
  float rhs;
  float fVar3;
  double dVar4;
  bool local_9f;
  int local_98;
  bool local_92;
  bool local_91;
  double v_cur_norm_curved;
  double v_new_norm_curved;
  double v_old_norm_curved;
  double v_old_ref_for_accum_remainder;
  double v_cur;
  bool is_drag_direction_change_with_power;
  bool is_already_past_limits_and_pushing_outward;
  ImVec2 IStack_60;
  bool is_just_activated;
  int local_58;
  float local_54;
  int decimal_precision;
  float adjust_delta;
  bool is_power;
  bool has_min_max;
  bool is_decimal;
  ImGuiContext *pIStack_48;
  ImGuiAxis axis;
  ImGuiContext *g;
  ImGuiDragFlags flags_local;
  float power_local;
  char *format_local;
  double v_max_local;
  double v_min_local;
  double *pdStack_18;
  float v_speed_local;
  double *v_local;
  ImGuiDataType data_type_local;
  
  pIStack_48 = GImGui;
  adjust_delta = (float)(uint)((flags & 1U) != 0);
  local_91 = data_type == 8 || data_type == 9;
  decimal_precision._3_1_ = local_91;
  decimal_precision._2_1_ = v_min != v_max;
  local_92 = false;
  if ((((power != 1.0) || (NAN(power))) && (local_92 = false, data_type == 8 || data_type == 9)) &&
     (local_92 = false, (bool)decimal_precision._2_1_)) {
    local_92 = v_max - v_min < 3.4028234663852886e+38;
  }
  decimal_precision._1_1_ = local_92;
  v_min_local._4_4_ = v_speed;
  if (((v_speed == 0.0) && (!NAN(v_speed))) &&
     (((bool)decimal_precision._2_1_ && (v_max - v_min < 3.4028234663852886e+38)))) {
    v_min_local._4_4_ = (float)((v_max - v_min) * (double)GImGui->DragSpeedDefaultRatio);
  }
  local_54 = 0.0;
  g._0_4_ = flags;
  g._4_4_ = power;
  _flags_local = format;
  format_local = (char *)v_max;
  v_max_local = v_min;
  pdStack_18 = v;
  v_local._0_4_ = data_type;
  if (((GImGui->ActiveIdSource != ImGuiInputSource_Mouse) ||
      (bVar1 = IsMousePosValid((ImVec2 *)0x0), !bVar1)) ||
     ((pIStack_48->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
    if (pIStack_48->ActiveIdSource == ImGuiInputSource_Nav) {
      if ((decimal_precision._3_1_ & 1) == 0) {
        local_98 = 0;
      }
      else {
        local_98 = ImParseFormatPrecision(_flags_local,3);
      }
      local_58 = local_98;
      IStack_60 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      pfVar2 = ImVec2::operator[](&stack0xffffffffffffffa0,(long)(int)adjust_delta);
      fVar3 = v_min_local._4_4_;
      local_54 = *pfVar2;
      rhs = GetMinimumStepAtDecimalPrecision(local_58);
      v_min_local._4_4_ = ImMax<float>(fVar3,rhs);
    }
  }
  else {
    pfVar2 = ImVec2::operator[](&(pIStack_48->IO).MouseDelta,(long)(int)adjust_delta);
    local_54 = *pfVar2;
    if (((pIStack_48->IO).KeyAlt & 1U) != 0) {
      local_54 = local_54 * 0.01;
    }
    if (((pIStack_48->IO).KeyShift & 1U) != 0) {
      local_54 = local_54 * 10.0;
    }
  }
  local_54 = v_min_local._4_4_ * local_54;
  if (adjust_delta == 1.4013e-45) {
    local_54 = -local_54;
  }
  local_9f = false;
  if (((decimal_precision._2_1_ & 1) != 0) &&
     ((*pdStack_18 < (double)format_local || (local_9f = true, local_54 <= 0.0)))) {
    local_9f = *pdStack_18 <= v_max_local && local_54 < 0.0;
  }
  bVar1 = false;
  if (((decimal_precision._1_1_ & 1) != 0) &&
     (((0.0 <= local_54 || (bVar1 = true, pIStack_48->DragCurrentAccum <= 0.0)) &&
      (bVar1 = false, 0.0 < local_54)))) {
    bVar1 = pIStack_48->DragCurrentAccum <= 0.0 && pIStack_48->DragCurrentAccum != 0.0;
  }
  if ((((pIStack_48->ActiveIdIsJustActivated & 1U) != 0) || (local_9f)) || (bVar1)) {
    pIStack_48->DragCurrentAccum = 0.0;
    pIStack_48->DragCurrentAccumDirty = false;
  }
  else if ((local_54 != 0.0) || (NAN(local_54))) {
    pIStack_48->DragCurrentAccum = local_54 + pIStack_48->DragCurrentAccum;
    pIStack_48->DragCurrentAccumDirty = true;
  }
  if ((pIStack_48->DragCurrentAccumDirty & 1U) == 0) {
    v_local._7_1_ = false;
  }
  else {
    v_old_norm_curved = 0.0;
    if ((decimal_precision._1_1_ & 1) == 0) {
      v_old_ref_for_accum_remainder = (double)pIStack_48->DragCurrentAccum + *pdStack_18;
    }
    else {
      v_old_norm_curved =
           ImPow((*pdStack_18 - v_max_local) / ((double)format_local - v_max_local),
                 1.0 / (double)g._4_4_);
      dVar4 = v_max_local;
      fVar3 = ImSaturate((float)(v_old_norm_curved +
                                (double)pIStack_48->DragCurrentAccum /
                                ((double)format_local - v_max_local)));
      fVar3 = ImPow(fVar3,g._4_4_);
      v_old_ref_for_accum_remainder = (double)fVar3 * ((double)format_local - v_max_local) + dVar4;
    }
    v_old_ref_for_accum_remainder =
         RoundScalarWithFormatT<double,double>
                   (_flags_local,(ImGuiDataType)v_local,v_old_ref_for_accum_remainder);
    pIStack_48->DragCurrentAccumDirty = false;
    if ((decimal_precision._1_1_ & 1) == 0) {
      pIStack_48->DragCurrentAccum =
           pIStack_48->DragCurrentAccum - (float)(v_old_ref_for_accum_remainder - *pdStack_18);
    }
    else {
      dVar4 = ImPow((v_old_ref_for_accum_remainder - v_max_local) /
                    ((double)format_local - v_max_local),1.0 / (double)g._4_4_);
      pIStack_48->DragCurrentAccum =
           pIStack_48->DragCurrentAccum - (float)(dVar4 - v_old_norm_curved);
    }
    if ((v_old_ref_for_accum_remainder == 0.0) && (!NAN(v_old_ref_for_accum_remainder))) {
      v_old_ref_for_accum_remainder = 0.0;
    }
    if (((*pdStack_18 != v_old_ref_for_accum_remainder) ||
        (NAN(*pdStack_18) || NAN(v_old_ref_for_accum_remainder))) &&
       ((decimal_precision._2_1_ & 1) != 0)) {
      if ((v_old_ref_for_accum_remainder < v_max_local) ||
         (((*pdStack_18 <= v_old_ref_for_accum_remainder &&
            v_old_ref_for_accum_remainder != *pdStack_18 && (local_54 < 0.0)) &&
          ((decimal_precision._3_1_ & 1) == 0)))) {
        v_old_ref_for_accum_remainder = v_max_local;
      }
      if (((double)format_local < v_old_ref_for_accum_remainder) ||
         (((v_old_ref_for_accum_remainder < *pdStack_18 && (0.0 < local_54)) &&
          ((decimal_precision._3_1_ & 1) == 0)))) {
        v_old_ref_for_accum_remainder = (double)format_local;
      }
    }
    if ((*pdStack_18 != v_old_ref_for_accum_remainder) ||
       (NAN(*pdStack_18) || NAN(v_old_ref_for_accum_remainder))) {
      *pdStack_18 = v_old_ref_for_accum_remainder;
      v_local._7_1_ = true;
    }
    else {
      v_local._7_1_ = false;
    }
  }
  return v_local._7_1_;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool has_min_max = (v_min != v_max);
    const bool is_power = (power != 1.0f && is_decimal && has_min_max && (v_max - v_min < FLT_MAX));

    // Default tweak speed
    if (v_speed == 0.0f && has_min_max && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = has_min_max && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (TYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (TYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && has_min_max)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}